

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall Image::EmplaceData(Image *this,string *filename)

{
  int iVar1;
  char *args;
  Box<Imath_2_5::Vec2<int>_> *pBVar2;
  unsigned_long args_00;
  size_type sVar3;
  Rgba *pRVar4;
  BaseExc *e;
  int dy;
  int dx;
  size_t datalen;
  int local_78;
  V2i dim;
  Box2i win;
  Rgba local_58;
  RgbaInputFile in;
  char *fn;
  string *filename_local;
  Image *this_local;
  
  args = (char *)std::__cxx11::string::c_str();
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&local_58,args,iVar1);
  pBVar2 = (Box<Imath_2_5::Vec2<int>_> *)Imf_2_5::RgbaInputFile::dataWindow();
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box((Box<Imath_2_5::Vec2<int>_> *)&dim,pBVar2);
  Imath_2_5::Vec2<int>::Vec2
            ((Vec2<int> *)((long)&datalen + 4),(win.min.x - dim.x) + 1,(win.min.y - dim.y) + 1);
  parallel_printf<char_const*,int,int>
            ("Loaded EXR \"%s\", image has %dx%d \n",args,datalen._4_4_,local_78);
  args_00 = (unsigned_long)(datalen._4_4_ * local_78);
  sVar3 = std::vector<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>::size(&this->m_Data);
  if (sVar3 != args_00) {
    parallel_printf<unsigned_long>("Allocating buffer for %ld pixels\n",args_00);
    std::vector<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>::resize(&this->m_Data,args_00);
  }
  iVar1 = dim.y;
  pRVar4 = std::vector<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>::data(&this->m_Data);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (&local_58,(ulong)(pRVar4 + (-(long)dim.x - (long)(iVar1 * datalen._4_4_))),1);
  Imf_2_5::RgbaInputFile::readPixels((int)&local_58,dim.y);
  Imath_2_5::Vec2<int>::operator=(&this->m_Size,(Vec2<int> *)((long)&datalen + 4));
  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&local_58);
  return;
}

Assistant:

void Image::EmplaceData(const std::string &filename) {

    auto fn = filename.c_str();

    try {

        Imf::RgbaInputFile in(fn);

        Imath::Box2i win = in.dataWindow();

        Imath::V2i dim(win.max.x - win.min.x + 1, win.max.y - win.min.y + 1);

        parallel_printf("Loaded EXR \"%s\", image has %dx%d \n", fn, dim.x,
                        dim.y);

        size_t datalen = dim.x * dim.y;

        {
        if (m_Data.size() != datalen) {
            parallel_printf("Allocating buffer for %ld pixels\n", datalen);
            m_Data.resize(datalen);
        }
        }

        int dx = win.min.x;
        int dy = win.min.y;

        in.setFrameBuffer(m_Data.data() - dx - dy * dim.x, 1, dim.x);
        in.readPixels(win.min.y, win.max.y);
        m_Size = dim;

    } catch (Iex::BaseExc &e) {
        parallel_printf("Error loading EXR from \"%s\" err=%s \n", fn,
                        e.what());
        throw;
    }
}